

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O0

void __thiscall
Js::IntlEngineInterfaceExtensionObject::EnsureIntlByteCode
          (IntlEngineInterfaceExtensionObject *this,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  HRESULT hr_00;
  FunctionBody **ppFVar4;
  undefined4 *puVar5;
  SRCINFO *srcInfo;
  uint uVar6;
  HRESULT hr;
  uint32 flags;
  SRCINFO *hsi;
  SRCINFO si;
  SourceContextInfo *sourceContextInfo;
  ScriptContext *scriptContext_local;
  IntlEngineInterfaceExtensionObject *this_local;
  
  ppFVar4 = Memory::WriteBarrierPtr::operator_cast_to_FunctionBody__
                      ((WriteBarrierPtr *)&this->intlByteCode);
  if (*ppFVar4 == (FunctionBody *)0x0) {
    si._32_8_ = ScriptContext::GetSourceContextInfo
                          (scriptContext,0xffffffffffffffff,(SimpleDataCacheWrapper *)0x0);
    if ((SourceContextInfo *)si._32_8_ == (SourceContextInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x2b7,"(sourceContextInfo != nullptr)",
                                  "sourceContextInfo != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    SRCINFO::SRCINFO((SRCINFO *)&hsi);
    memset(&hsi,0,0x28);
    Memory::WriteBarrierPtr<SourceContextInfo>::operator=
              ((WriteBarrierPtr<SourceContextInfo> *)&hsi,(SourceContextInfo *)si._32_8_);
    srcInfo = ScriptContext::AddHostSrcInfo(scriptContext,(SRCINFO *)&hsi);
    bVar2 = false;
    if ((DAT_01e9e300 & 1) != 0) {
      BVar3 = ScriptContext::IsProfiling(scriptContext);
      bVar2 = BVar3 == 0;
    }
    uVar6 = 0;
    if (bVar2) {
      uVar6 = 0x10000;
    }
    hr_00 = ByteCodeSerializer::DeserializeFromBuffer
                      (scriptContext,uVar6 | 0x20000,(LPCUTF8)0x0,srcInfo,js::Library_Bytecode_Intl,
                       (NativeModule *)0x0,&this->intlByteCode,0xffffffff);
    if (hr_00 < 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x2c1,"(false)",
                                  "Failed to deserialize Intl.js bytecode - very probably the bytecode needs to be rebuilt."
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
      JavascriptError::MapAndThrowError(scriptContext,hr_00);
    }
    EngineExtensionObjectBase::SetHasBytecode(&this->super_EngineExtensionObjectBase);
  }
  return;
}

Assistant:

void IntlEngineInterfaceExtensionObject::EnsureIntlByteCode(_In_ ScriptContext * scriptContext)
    {
        if (this->intlByteCode == nullptr)
        {
            SourceContextInfo * sourceContextInfo = scriptContext->GetSourceContextInfo(Js::Constants::NoHostSourceContext, NULL);

            Assert(sourceContextInfo != nullptr);

            SRCINFO si;
            memset(&si, 0, sizeof(si));
            si.sourceContextInfo = sourceContextInfo;
            SRCINFO *hsi = scriptContext->AddHostSrcInfo(&si);
            uint32 flags = fscrIsLibraryCode | (CONFIG_FLAG(CreateFunctionProxy) && !scriptContext->IsProfiling() ? fscrAllowFunctionProxy : 0);

            HRESULT hr = Js::ByteCodeSerializer::DeserializeFromBuffer(scriptContext, flags, (LPCUTF8)nullptr, hsi, (byte*)js::Library_Bytecode_Intl, nullptr, &this->intlByteCode);

            IfFailAssertMsgAndThrowHr(hr, "Failed to deserialize Intl.js bytecode - very probably the bytecode needs to be rebuilt.");

            this->SetHasBytecode();
        }
    }